

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

void rd_1dim_slice(char **content,size_t *line_no,int *array,int dim,int shift,int post)

{
  size_t sVar1;
  char cVar2;
  int iVar3;
  char *__haystack;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  double dVar11;
  int p;
  int pp;
  int local_78;
  int local_74;
  size_t *local_70;
  int local_64;
  int *local_60;
  uint local_58 [6];
  double local_40;
  char **local_38;
  
  iVar5 = dim - (post + shift);
  pcVar10 = (char *)0x0;
  local_38 = content;
  if (0 < iVar5) {
    local_60 = array + shift;
    local_74 = 0;
    iVar8 = 0;
    local_70 = line_no;
    do {
      sVar1 = *line_no;
      *line_no = sVar1 + 1;
      pcVar10 = local_38[sVar1];
      if (pcVar10 == (char *)0x0) {
        vrna_message_error("unexpected end of file in get_array1");
      }
      __haystack = strstr(pcVar10,"/*");
      if (__haystack != (char *)0x0) {
        pcVar4 = strstr(__haystack,"*/");
        if (pcVar4 == (char *)0x0) {
          vrna_message_error("unclosed comment in parameter file");
        }
        cVar2 = pcVar4[2];
        if (cVar2 != '\0') {
          pcVar4 = pcVar4 + 3;
          do {
            *__haystack = cVar2;
            __haystack = __haystack + 1;
            cVar2 = *pcVar4;
            pcVar4 = pcVar4 + 1;
          } while (cVar2 != '\0');
        }
        *__haystack = '\0';
      }
      iVar6 = iVar8;
      if (iVar8 < iVar5) {
        lVar9 = 0;
        do {
          piVar7 = local_60 + iVar8;
          iVar6 = iVar8;
          while( true ) {
            iVar3 = __isoc99_sscanf(pcVar10 + (int)lVar9,"%15s%n",local_58,&local_64);
            line_no = local_70;
            if (iVar3 != 1) goto LAB_00129b1f;
            lVar9 = (long)local_64 + (long)(int)lVar9;
            if ((local_58[0] & 0xff) != 0x2a) break;
            iVar6 = iVar6 + 1;
            piVar7 = piVar7 + 1;
            if (iVar5 <= iVar6) {
              iVar6 = iVar8 + 1;
              if (iVar8 + 1 < iVar5) {
                iVar6 = iVar5;
              }
              goto LAB_00129b1f;
            }
          }
          if ((local_58[0] & 0xff) == 0x78) {
            if (iVar6 == 0) {
              vrna_message_error("can\'t extrapolate first value");
            }
            iVar8 = local_60[local_74];
            local_40 = lxc37;
            dVar11 = log((double)iVar6 / (double)local_74);
            local_78 = (int)(dVar11 * local_40 + 0.5) + iVar8;
          }
          else if (local_58[0] == 0x54534e) {
            local_78 = 0;
          }
          else if (local_58[0] == 0x464e49) {
            local_78 = 10000000;
          }
          else if (local_58[0] == 0x464544) {
            local_78 = -0x32;
          }
          else {
            iVar8 = __isoc99_sscanf(local_58,"%d",&local_78);
            local_74 = iVar6;
            if (iVar8 != 1) {
              pcVar10 = pcVar10 + lVar9;
              goto LAB_00129b2d;
            }
          }
          iVar8 = iVar6 + 1;
          *piVar7 = local_78;
        } while (iVar8 < iVar5);
        line_no = local_70;
        iVar6 = iVar6 + 1;
      }
LAB_00129b1f:
      iVar8 = iVar6;
    } while (iVar8 < iVar5);
    pcVar10 = (char *)0x0;
  }
LAB_00129b2d:
  if (pcVar10 != (char *)0x0) {
    vrna_message_error("\nrd_1dim: %s",pcVar10);
  }
  return;
}

Assistant:

PRIVATE void
rd_1dim_slice(char    **content,
              size_t  *line_no,
              int     *array,
              int     dim,
              int     shift,
              int     post)
{
  char *cp;

  cp = get_array1(content, line_no, array + shift, dim - shift - post);

  if (cp) {
    vrna_message_error("\nrd_1dim: %s", cp);
    exit(1);
  }

  return;
}